

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

void __thiscall
duckdb_fmt::v6::
format_handler<duckdb_fmt::v6::arg_formatter<duckdb_fmt::v6::buffer_range<char>_>,_char,_duckdb_fmt::v6::basic_format_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>_>,_char>_>
::on_arg_id(format_handler<duckdb_fmt::v6::arg_formatter<duckdb_fmt::v6::buffer_range<char>_>,_char,_duckdb_fmt::v6::basic_format_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>_>,_char>_>
            *this,int id)

{
  int in_stack_0000001c;
  format_handler<duckdb_fmt::v6::arg_formatter<duckdb_fmt::v6::buffer_range<char>_>,_char,_duckdb_fmt::v6::basic_format_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>_>,_char>_>
  *in_stack_00000020;
  int in_stack_0000002c;
  basic_format_parse_context<char,_duckdb_fmt::v6::internal::error_handler> *in_stack_00000030;
  
  basic_format_parse_context<char,_duckdb_fmt::v6::internal::error_handler>::check_arg_id
            (in_stack_00000030,in_stack_0000002c);
  get_arg(in_stack_00000020,in_stack_0000001c);
  return;
}

Assistant:

void on_arg_id(int id) {
    parse_context.check_arg_id(id);
    get_arg(id);
  }